

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_jumps.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5dbd0::ir_lower_jumps_visitor::move_outer_block_inside
          (ir_lower_jumps_visitor *this,ir_instruction *ir,exec_list *inner_block)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  
  while( true ) {
    plVar1 = *(long **)&this->progress;
    lVar2 = *plVar1;
    if (lVar2 == 0) break;
    plVar3 = (long *)plVar1[1];
    *(long **)(lVar2 + 8) = plVar3;
    *plVar3 = lVar2;
    plVar1[1] = 0;
    *plVar1 = (long)&(ir->super_exec_node).prev;
    puVar4 = *(undefined8 **)&ir->ir_type;
    plVar1[1] = (long)puVar4;
    *puVar4 = plVar1;
    *(long **)&ir->ir_type = plVar1;
  }
  return;
}

Assistant:

void move_outer_block_inside(ir_instruction *ir, exec_list *inner_block)
   {
      while (!ir->get_next()->is_tail_sentinel()) {
         ir_instruction *move_ir = (ir_instruction *)ir->get_next();

         move_ir->remove();
         inner_block->push_tail(move_ir);
      }
   }